

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Rsa.cpp
# Opt level: O2

bool __thiscall
axl::cry::Rsa::signHash
          (Rsa *this,int type,Array<char,_axl::sl::ArrayDetails<char>_> *signature,void *hash,
          size_t hashSize)

{
  bool bVar1;
  size_t sVar2;
  char *signatureBuffer;
  
  sVar2 = getSize(this);
  bVar1 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::
          setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(signature,sVar2);
  if (bVar1) {
    signatureBuffer = sl::Array<char,_axl::sl::ArrayDetails<char>_>::p(signature);
    sVar2 = signHash(this,type,signatureBuffer,sVar2,hash,hashSize);
    if (sVar2 != 0xffffffffffffffff) {
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::
      setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(signature,sVar2);
      return true;
    }
  }
  return false;
}

Assistant:

bool
Rsa::signHash(
	int type,
	sl::Array<char>* signature,
	const void* hash,
	size_t hashSize
) {
	size_t signatureBufferSize = getSize();
	bool result = signature->setCount(signatureBufferSize);
	if (!result)
		return false;

	size_t size = signHash(type, signature->p(), signatureBufferSize, hash, hashSize);
	if (size == -1)
		return false;

	ASSERT(size <= signatureBufferSize);
	signature->setCount(size);
	return true;
}